

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O3

int testOptionalInputs(void)

{
  pointer pcVar1;
  undefined8 uVar2;
  bool bVar3;
  ostream *poVar4;
  uint uVar5;
  Arena *pAVar6;
  Model m3;
  Model m2;
  Model m4;
  Model m1;
  undefined1 local_108 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  uint32_t local_dc [1];
  undefined1 local_d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  uint32_t local_ac [1];
  undefined1 local_a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  uint32_t local_7c [1];
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50,(Arena *)0x0,false);
  if (local_50._oneof_case_[0] != 0x25f) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 0x25f;
    pAVar6 = (Arena *)(local_50.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_50.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    local_50.Type_.normalizer_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Normalizer>(pAVar6);
  }
  ((local_50.Type_.supportvectorclassifier_)->numberofsupportvectorsperclass_).current_size_ = 2;
  pcVar1 = local_d8 + 0x10;
  local_d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"x","");
  addRequiredField(&local_50,(string *)local_d8);
  if ((pointer)local_d8._0_8_ != pcVar1) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  CoreML::validateOptional((Result *)local_d8,&local_50);
  bVar3 = CoreML::Result::good((Result *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._8_8_ != &local_c0) {
    operator_delete((void *)local_d8._8_8_,local_c0._0_8_ + 1);
  }
  if (bVar3) {
    local_d8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"y","");
    addOptionalField(&local_50,(string *)local_d8);
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    CoreML::validateOptional((Result *)local_d8,&local_50);
    bVar3 = CoreML::Result::good((Result *)local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._8_8_ != &local_c0) {
      operator_delete((void *)local_d8._8_8_,local_c0._0_8_ + 1);
    }
    if (!bVar3) {
      CoreML::Specification::Model::Model((Model *)local_d8,(Arena *)0x0,false);
      if (local_ac[0] != 0x259) {
        CoreML::Specification::Model::clear_Type((Model *)local_d8);
        local_ac[0] = 0x259;
        pAVar6 = (Arena *)(local_d8._8_8_ & 0xfffffffffffffffc);
        if ((local_d8._8_8_ & 1) != 0) {
          pAVar6 = *(Arena **)pAVar6;
        }
        local_c0._8_8_ =
             google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Imputer>(pAVar6);
      }
      uVar2 = local_c0._8_8_;
      if (*(uint32_t *)(local_c0._8_8_ + 0x24) != 1) {
        CoreML::Specification::Imputer::clear_ImputedValue((Imputer *)local_c0._8_8_);
        *(uint32_t *)(uVar2 + 0x24) = 1;
      }
      ((ImputedValueUnion *)(uVar2 + 0x10))->imputeddoublearray_ =
           (DoubleVector *)0x40091eb851eb851f;
      pcVar1 = local_108 + 0x10;
      local_108._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"x","");
      addRequiredField((Model *)local_d8,(string *)local_108);
      if ((pointer)local_108._0_8_ != pcVar1) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      local_108._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"y","");
      addOptionalField((Model *)local_d8,(string *)local_108);
      if ((pointer)local_108._0_8_ != pcVar1) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      CoreML::validateOptional((Result *)local_108,(Model *)local_d8);
      bVar3 = CoreML::Result::good((Result *)local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._8_8_ != &local_f0) {
        operator_delete((void *)local_108._8_8_,local_f0._0_8_ + 1);
      }
      if (bVar3) {
        local_108._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"z","");
        addOptionalField((Model *)local_d8,(string *)local_108);
        if ((pointer)local_108._0_8_ != pcVar1) {
          operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
        }
        CoreML::validateOptional((Result *)local_108,(Model *)local_d8);
        bVar3 = CoreML::Result::good((Result *)local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._8_8_ != &local_f0) {
          operator_delete((void *)local_108._8_8_,local_f0._0_8_ + 1);
        }
        if (!bVar3) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                     ,0x66);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x40);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"(validateOptional(m2)).good()",0x1d);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          goto LAB_0013ea5a;
        }
        CoreML::Specification::Model::Model((Model *)local_108,(Arena *)0x0,false);
        if (local_dc[0] != 0x12e) {
          CoreML::Specification::Model::clear_Type((Model *)local_108);
          local_dc[0] = 0x12e;
          pAVar6 = (Arena *)(local_108._8_8_ & 0xfffffffffffffffc);
          if ((local_108._8_8_ & 1) != 0) {
            pAVar6 = *(Arena **)pAVar6;
          }
          local_f0._8_8_ =
               google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::TreeEnsembleRegressor>(pAVar6);
        }
        local_a8._0_8_ = local_a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"x","");
        addRequiredField((Model *)local_108,(string *)local_a8);
        if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
          operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
        }
        CoreML::validateOptional((Result *)local_a8,(Model *)local_108);
        bVar3 = CoreML::Result::good((Result *)local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._8_8_ != &local_90) {
          operator_delete((void *)local_a8._8_8_,local_90._0_8_ + 1);
        }
        if (bVar3) {
          CoreML::Specification::Model::Model((Model *)local_a8,(Arena *)0x0,false);
          if (local_7c[0] != 0x12e) {
            CoreML::Specification::Model::clear_Type((Model *)local_a8);
            local_7c[0] = 0x12e;
            pAVar6 = (Arena *)(local_a8._8_8_ & 0xfffffffffffffffc);
            if ((local_a8._8_8_ & 1) != 0) {
              pAVar6 = *(Arena **)pAVar6;
            }
            local_90._8_8_ =
                 google::protobuf::Arena::
                 CreateMaybeMessage<CoreML::Specification::TreeEnsembleRegressor>(pAVar6);
          }
          local_78._0_8_ = local_78 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"x","");
          addOptionalField((Model *)local_a8,(string *)local_78);
          if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
            operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
          }
          CoreML::validateOptional((Result *)local_78,(Model *)local_a8);
          bVar3 = CoreML::Result::good((Result *)local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._8_8_ != &local_60) {
            operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
          }
          if (!bVar3) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                       ,0x66);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x4b);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,"(validateOptional(m4)).good()",0x1d);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4," was false, expected true.",0x1a);
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          uVar5 = (uint)!bVar3;
          CoreML::Specification::Model::~Model((Model *)local_a8);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                     ,0x66);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x46);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"(validateOptional(m3)).good()",0x1d);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          uVar5 = 1;
          std::ostream::flush();
        }
        CoreML::Specification::Model::~Model((Model *)local_108);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                   ,0x66);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x3d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"(validateOptional(m2)).good()",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
LAB_0013ea5a:
        std::ostream::put((char)poVar4);
        uVar5 = 1;
        std::ostream::flush();
      }
      CoreML::Specification::Model::~Model((Model *)local_d8);
      goto LAB_0013eb35;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"!((validateOptional(m1)).good())",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(validateOptional(m1)).good()",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  }
  std::ostream::put((char)poVar4);
  uVar5 = 1;
  std::ostream::flush();
LAB_0013eb35:
  CoreML::Specification::Model::~Model(&local_50);
  return uVar5;
}

Assistant:

int testOptionalInputs() {
    // Test that all fields are required on a random model (normalizer)
    Specification::Model m1;
    m1.mutable_normalizer()->set_normtype(Specification::Normalizer_NormType::Normalizer_NormType_L2);
    addRequiredField(m1, "x");
    ML_ASSERT_GOOD(validateOptional(m1));

    addOptionalField(m1, "y");
    ML_ASSERT_BAD(validateOptional(m1));

    // Test that at least one optional field is required on an imputer
    // (more than one allowed)
    Specification::Model m2;
    m2.mutable_imputer()->set_imputeddoublevalue(3.14);
    addRequiredField(m2, "x");
    addOptionalField(m2, "y");
    ML_ASSERT_GOOD(validateOptional(m2));

    addOptionalField(m2, "z");
    ML_ASSERT_GOOD(validateOptional(m2));

    // Test that any fields can be optional or required for trees
    Specification::Model m3;
    (void) m3.mutable_treeensembleregressor();
    addRequiredField(m3, "x");
    ML_ASSERT_GOOD(validateOptional(m3));

    Specification::Model m4;
    (void) m4.mutable_treeensembleregressor();
    addOptionalField(m4, "x");
    ML_ASSERT_GOOD(validateOptional(m4));

    return 0;
}